

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__metadata_process_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata_type allowedMetadataTypes)

{
  ma_bool32 mVar1;
  int iVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  size_t sVar5;
  ma_dr_wav_metadata *pParser_00;
  uint in_EDX;
  ma_uint8 *in_RSI;
  ma_dr_wav_metadata *in_RDI;
  ma_uint64 bytesToSeek;
  ma_uint64 stringSizeWithNullTerminator;
  ma_uint64 stringSizeWithNullTerm;
  ma_uint64 bytesJustRead_2;
  ma_uint64 subchunkBytesRead;
  ma_uint64 subchunkDataSize;
  ma_uint8 subchunkSizeBuffer [4];
  ma_uint8 subchunkId [4];
  ma_dr_wav_metadata_location listType;
  size_t bytesJustRead_1;
  size_t allocSizeNeeded;
  char buffer_1 [257];
  size_t cueCount;
  ma_uint32 samplerSpecificDataSizeInBytes;
  ma_uint64 calculatedLoopCount;
  ma_uint32 loopCount;
  size_t bytesJustRead;
  ma_uint8 buffer [4];
  ma_uint64 bytesRead;
  ma_uint8 *pChunkID;
  char *in_stack_fffffffffffffe28;
  ma_dr_wav_metadata *in_stack_fffffffffffffe30;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffe38;
  ma_dr_wav_metadata *in_stack_fffffffffffffe40;
  ma_dr_wav_metadata *chunkSize;
  ma_dr_wav_metadata_type mVar6;
  ma_dr_wav_metadata *in_stack_fffffffffffffe48;
  ma_dr_wav_metadata *in_stack_fffffffffffffe50;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffe58;
  ma_dr_wav_metadata *in_stack_fffffffffffffe68;
  ma_dr_wav_metadata *pMetadata;
  ma_dr_wav_chunk_header *in_stack_fffffffffffffe70;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffe78;
  ma_uint8 local_180 [4];
  undefined4 local_17c;
  ma_dr_wav_metadata *in_stack_fffffffffffffe88;
  ma_dr_wav_chunk_header *in_stack_fffffffffffffe90;
  long lVar7;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffe98;
  ma_uint8 local_34 [4];
  ma_uint8 *local_30;
  ma_uint8 *local_28;
  uint local_1c;
  ma_uint8 *local_18;
  ma_dr_wav_metadata *local_10;
  
  local_30 = (ma_uint8 *)0x0;
  local_28 = in_RSI;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  mVar1 = ma_dr_wav__chunk_matches
                    ((ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                     (ma_uint8 *)in_stack_fffffffffffffe38,
                     (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                     in_stack_fffffffffffffe28);
  if (mVar1 == 0) {
    mVar1 = ma_dr_wav__chunk_matches
                      ((ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                       (ma_uint8 *)in_stack_fffffffffffffe38,
                       (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                       in_stack_fffffffffffffe28);
    if (mVar1 == 0) {
      mVar1 = ma_dr_wav__chunk_matches
                        ((ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                         (ma_uint8 *)in_stack_fffffffffffffe38,
                         (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                         in_stack_fffffffffffffe28);
      if (mVar1 == 0) {
        mVar1 = ma_dr_wav__chunk_matches
                          ((ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                           (ma_uint8 *)in_stack_fffffffffffffe38,
                           (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                           in_stack_fffffffffffffe28);
        if (mVar1 == 0) {
          mVar1 = ma_dr_wav__chunk_matches
                            ((ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                             (ma_uint8 *)in_stack_fffffffffffffe38,
                             (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                             in_stack_fffffffffffffe28);
          if (mVar1 == 0) {
            mVar1 = ma_dr_wav_fourcc_equal(local_28,"LIST");
            if ((mVar1 == 0) && (mVar1 = ma_dr_wav_fourcc_equal(local_28,"list"), mVar1 == 0)) {
              if ((local_1c & 1) != 0) {
                local_30 = (ma_uint8 *)
                           ma_dr_wav__metadata_process_unknown_chunk
                                     ((ma_dr_wav__metadata_parser *)in_stack_fffffffffffffe48,
                                      (ma_uint8 *)in_stack_fffffffffffffe40,
                                      (ma_uint64)in_stack_fffffffffffffe38,
                                      (ma_dr_wav_metadata_location)
                                      ((ulong)in_stack_fffffffffffffe30 >> 0x20));
              }
            }
            else {
              local_17c = 0;
              while (local_30 < *(ma_uint8 **)(local_18 + 0x10)) {
                pMetadata = (ma_dr_wav_metadata *)0x0;
                sVar5 = ma_dr_wav__metadata_parser_read
                                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                   (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x216643);
                if (sVar5 != 4) {
                  return (ma_uint64)local_30;
                }
                mVar1 = ma_dr_wav_fourcc_equal(local_180,"adtl");
                if (mVar1 == 0) {
                  mVar1 = ma_dr_wav_fourcc_equal(local_180,"INFO");
                  if (mVar1 == 0) {
                    sVar5 = ma_dr_wav__metadata_parser_read
                                      (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                       (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x2166b9);
                    if (sVar5 != 4) {
                      return (ma_uint64)local_30;
                    }
                    mVar3 = ma_dr_wav_bytes_to_u32(&stack0xfffffffffffffe7c);
                    pParser_00 = (ma_dr_wav_metadata *)(ulong)mVar3;
                    mVar1 = ma_dr_wav__chunk_matches
                                      ((ma_dr_wav_metadata_type)
                                       ((ulong)in_stack_fffffffffffffe40 >> 0x20),
                                       (ma_uint8 *)in_stack_fffffffffffffe38,
                                       (ma_dr_wav_metadata_type)
                                       ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                       in_stack_fffffffffffffe28);
                    chunkSize = pParser_00;
                    if ((mVar1 == 0) &&
                       (mVar1 = ma_dr_wav__chunk_matches
                                          ((ma_dr_wav_metadata_type)
                                           ((ulong)in_stack_fffffffffffffe40 >> 0x20),
                                           (ma_uint8 *)in_stack_fffffffffffffe38,
                                           (ma_dr_wav_metadata_type)
                                           ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                           in_stack_fffffffffffffe28), chunkSize = pParser_00,
                       mVar1 == 0)) {
                      mVar1 = ma_dr_wav__chunk_matches
                                        ((ma_dr_wav_metadata_type)
                                         ((ulong)in_stack_fffffffffffffe40 >> 0x20),
                                         (ma_uint8 *)in_stack_fffffffffffffe38,
                                         (ma_dr_wav_metadata_type)
                                         ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                         in_stack_fffffffffffffe28);
                      if (mVar1 == 0) {
                        mVar1 = ma_dr_wav__chunk_matches
                                          ((ma_dr_wav_metadata_type)
                                           ((ulong)in_stack_fffffffffffffe40 >> 0x20),
                                           (ma_uint8 *)in_stack_fffffffffffffe38,
                                           (ma_dr_wav_metadata_type)
                                           ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                           in_stack_fffffffffffffe28);
                        mVar6 = (ma_dr_wav_metadata_type)((ulong)in_stack_fffffffffffffe40 >> 0x20);
                        if (mVar1 == 0) {
                          mVar1 = ma_dr_wav__chunk_matches
                                            (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                             (ma_dr_wav_metadata_type)
                                             ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                             in_stack_fffffffffffffe28);
                          mVar6 = (ma_dr_wav_metadata_type)
                                  ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                          if (mVar1 == 0) {
                            mVar1 = ma_dr_wav__chunk_matches
                                              (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                               (ma_dr_wav_metadata_type)
                                               ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                               in_stack_fffffffffffffe28);
                            mVar6 = (ma_dr_wav_metadata_type)
                                    ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                            if (mVar1 == 0) {
                              mVar1 = ma_dr_wav__chunk_matches
                                                (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                                 (ma_dr_wav_metadata_type)
                                                 ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                                 in_stack_fffffffffffffe28);
                              mVar6 = (ma_dr_wav_metadata_type)
                                      ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                              if (mVar1 == 0) {
                                mVar1 = ma_dr_wav__chunk_matches
                                                  (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                                   (ma_dr_wav_metadata_type)
                                                   ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                                   in_stack_fffffffffffffe28);
                                mVar6 = (ma_dr_wav_metadata_type)
                                        ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                                if (mVar1 == 0) {
                                  mVar1 = ma_dr_wav__chunk_matches
                                                    (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                                     (ma_dr_wav_metadata_type)
                                                     ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                                     in_stack_fffffffffffffe28);
                                  mVar6 = (ma_dr_wav_metadata_type)
                                          ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                                  if (mVar1 == 0) {
                                    mVar1 = ma_dr_wav__chunk_matches
                                                      (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38,
                                                       (ma_dr_wav_metadata_type)
                                                       ((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                                       in_stack_fffffffffffffe28);
                                    mVar6 = (ma_dr_wav_metadata_type)
                                            ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                                    if (mVar1 == 0) {
                                      mVar1 = ma_dr_wav__chunk_matches
                                                        (mVar6,(ma_uint8 *)in_stack_fffffffffffffe38
                                                         ,(ma_dr_wav_metadata_type)
                                                          ((ulong)in_stack_fffffffffffffe30 >> 0x20)
                                                         ,in_stack_fffffffffffffe28);
                                      mVar6 = (ma_dr_wav_metadata_type)
                                              ((ulong)in_stack_fffffffffffffe40 >> 0x20);
                                      if (mVar1 == 0) {
                                        mVar1 = ma_dr_wav__chunk_matches
                                                          (mVar6,(ma_uint8 *)
                                                                 in_stack_fffffffffffffe38,
                                                           (ma_dr_wav_metadata_type)
                                                           ((ulong)in_stack_fffffffffffffe30 >> 0x20
                                                           ),in_stack_fffffffffffffe28);
                                        if (mVar1 == 0) {
                                          if ((local_1c & 1) != 0) {
                                            pMetadata = (ma_dr_wav_metadata *)
                                                        ma_dr_wav__metadata_process_unknown_chunk
                                                                  ((ma_dr_wav__metadata_parser *)
                                                                   in_stack_fffffffffffffe48,
                                                                   (ma_uint8 *)
                                                                   in_stack_fffffffffffffe40,
                                                                   (ma_uint64)
                                                                   in_stack_fffffffffffffe38,
                                                                   (ma_dr_wav_metadata_location)
                                                                   ((ulong)in_stack_fffffffffffffe30
                                                                   >> 0x20));
                                          }
                                        }
                                        else {
                                          pMetadata = (ma_dr_wav_metadata *)
                                                      ma_dr_wav__metadata_process_info_text_chunk
                                                                ((ma_dr_wav__metadata_parser *)
                                                                 in_stack_fffffffffffffe50,
                                                                 (ma_uint64)
                                                                 in_stack_fffffffffffffe48,
                                                                 (ma_dr_wav_metadata_type)
                                                                 ((ulong)in_stack_fffffffffffffe40
                                                                 >> 0x20));
                                        }
                                      }
                                      else {
                                        pMetadata = (ma_dr_wav_metadata *)
                                                    ma_dr_wav__metadata_process_info_text_chunk
                                                              ((ma_dr_wav__metadata_parser *)
                                                               in_stack_fffffffffffffe50,
                                                               (ma_uint64)in_stack_fffffffffffffe48,
                                                               mVar6);
                                      }
                                    }
                                    else {
                                      pMetadata = (ma_dr_wav_metadata *)
                                                  ma_dr_wav__metadata_process_info_text_chunk
                                                            ((ma_dr_wav__metadata_parser *)
                                                             in_stack_fffffffffffffe50,
                                                             (ma_uint64)in_stack_fffffffffffffe48,
                                                             mVar6);
                                    }
                                  }
                                  else {
                                    pMetadata = (ma_dr_wav_metadata *)
                                                ma_dr_wav__metadata_process_info_text_chunk
                                                          ((ma_dr_wav__metadata_parser *)
                                                           in_stack_fffffffffffffe50,
                                                           (ma_uint64)in_stack_fffffffffffffe48,
                                                           mVar6);
                                  }
                                }
                                else {
                                  pMetadata = (ma_dr_wav_metadata *)
                                              ma_dr_wav__metadata_process_info_text_chunk
                                                        ((ma_dr_wav__metadata_parser *)
                                                         in_stack_fffffffffffffe50,
                                                         (ma_uint64)in_stack_fffffffffffffe48,mVar6)
                                  ;
                                }
                              }
                              else {
                                pMetadata = (ma_dr_wav_metadata *)
                                            ma_dr_wav__metadata_process_info_text_chunk
                                                      ((ma_dr_wav__metadata_parser *)
                                                       in_stack_fffffffffffffe50,
                                                       (ma_uint64)in_stack_fffffffffffffe48,mVar6);
                              }
                            }
                            else {
                              pMetadata = (ma_dr_wav_metadata *)
                                          ma_dr_wav__metadata_process_info_text_chunk
                                                    ((ma_dr_wav__metadata_parser *)
                                                     in_stack_fffffffffffffe50,
                                                     (ma_uint64)in_stack_fffffffffffffe48,mVar6);
                            }
                          }
                          else {
                            pMetadata = (ma_dr_wav_metadata *)
                                        ma_dr_wav__metadata_process_info_text_chunk
                                                  ((ma_dr_wav__metadata_parser *)
                                                   in_stack_fffffffffffffe50,
                                                   (ma_uint64)in_stack_fffffffffffffe48,mVar6);
                          }
                        }
                        else {
                          pMetadata = (ma_dr_wav_metadata *)
                                      ma_dr_wav__metadata_process_info_text_chunk
                                                ((ma_dr_wav__metadata_parser *)
                                                 in_stack_fffffffffffffe50,
                                                 (ma_uint64)in_stack_fffffffffffffe48,mVar6);
                        }
                      }
                      else if ((ma_dr_wav_metadata *)0x13 < pParser_00) {
                        in_stack_fffffffffffffe50 =
                             (ma_dr_wav_metadata *)((long)&pParser_00[-1].data + 0x54);
                        if ((local_10->data).smpl.midiPitchFraction == 0) {
                          (local_10->data).smpl.samplerSpecificDataSizeInBytes =
                               (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
                          ma_dr_wav__metadata_request_extra_memory_for_stage_2
                                    ((ma_dr_wav__metadata_parser *)local_10,
                                     (size_t)in_stack_fffffffffffffe50,1);
                        }
                        else {
                          pMetadata = (ma_dr_wav_metadata *)
                                      ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj
                                                ((ma_dr_wav__metadata_parser *)pParser_00,pMetadata,
                                                 sVar5);
                          if (pMetadata == pParser_00) {
                            *(long *)((long)&local_10->data + 0x38) =
                                 *(long *)((long)&local_10->data + 0x38) + 1;
                          }
                        }
                      }
                    }
                    else {
                      pParser_00 = chunkSize;
                      if ((ma_dr_wav_metadata *)0x3 < chunkSize) {
                        if ((local_10->data).smpl.midiPitchFraction == 0) {
                          (local_10->data).smpl.samplerSpecificDataSizeInBytes =
                               (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
                          ma_dr_wav__metadata_request_extra_memory_for_stage_2
                                    ((ma_dr_wav__metadata_parser *)local_10,
                                     (size_t)((long)&chunkSize[-1].data + 100),1);
                          pParser_00 = chunkSize;
                        }
                        else {
                          in_stack_fffffffffffffe38 =
                               (ma_dr_wav__metadata_parser *)
                               ((local_10->data).labelledCueRegion.pString +
                               *(long *)((long)&local_10->data + 0x38) * 0x70);
                          in_stack_fffffffffffffe30 = local_10;
                          ma_dr_wav_fourcc_equal(local_180,"labl");
                          pMetadata = (ma_dr_wav_metadata *)
                                      ma_dr_wav__read_list_label_or_note_to_metadata_obj
                                                ((ma_dr_wav__metadata_parser *)
                                                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                                                 ,(ma_uint64)chunkSize,
                                                 (ma_dr_wav_metadata_type)
                                                 ((ulong)in_stack_fffffffffffffe38 >> 0x20));
                          in_stack_fffffffffffffe40 = chunkSize;
                          if (pMetadata == pParser_00) {
                            *(long *)((long)&local_10->data + 0x38) =
                                 *(long *)((long)&local_10->data + 0x38) + 1;
                          }
                        }
                      }
                    }
                    local_30 = local_30 + (long)&pMetadata->type;
                    if (pMetadata < pParser_00) {
                      in_stack_fffffffffffffe48 =
                           (ma_dr_wav_metadata *)((long)pParser_00 - (long)pMetadata);
                      iVar2 = (**(code **)&local_10->data)
                                        ((local_10->data).cue.pCuePoints,
                                         (ulong)in_stack_fffffffffffffe48 & 0xffffffff,1);
                      if (iVar2 == 0) {
                        return (ma_uint64)local_30;
                      }
                      local_30 = local_30 + (long)&in_stack_fffffffffffffe48->type;
                    }
                    if (((ulong)pParser_00 & 1) == 1) {
                      iVar2 = (**(code **)&local_10->data)((local_10->data).cue.pCuePoints,1);
                      if (iVar2 == 0) {
                        return (ma_uint64)local_30;
                      }
                      local_30 = local_30 + 1;
                    }
                  }
                  else {
                    local_17c = 2;
                  }
                }
                else {
                  local_17c = 3;
                }
              }
            }
          }
          else if (0x259 < *(ulong *)(local_18 + 0x10)) {
            if ((local_10->data).smpl.midiPitchFraction == 0) {
              lVar7 = 0x40;
              sVar5 = ma_dr_wav__metadata_parser_read
                                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                 (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x216408);
              if (sVar5 != 0x100) {
                return (ma_uint64)local_30;
              }
              sVar5 = ma_dr_wav__strlen(&stack0xfffffffffffffe98);
              lVar7 = sVar5 + 1 + lVar7;
              sVar5 = ma_dr_wav__metadata_parser_read
                                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                 (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x21646c);
              if (sVar5 != 0x20) {
                return (ma_uint64)local_30;
              }
              sVar5 = ma_dr_wav__strlen(&stack0xfffffffffffffe98);
              lVar7 = sVar5 + 1 + lVar7;
              sVar5 = ma_dr_wav__metadata_parser_read
                                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                 (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x2164cd);
              if (sVar5 != 0x20) {
                return (ma_uint64)local_30;
              }
              sVar5 = ma_dr_wav__strlen(&stack0xfffffffffffffe98);
              ma_dr_wav__metadata_request_extra_memory_for_stage_2
                        ((ma_dr_wav__metadata_parser *)local_10,
                         *(long *)(local_18 + 0x10) + (sVar5 - 0x259) + lVar7,1);
              (local_10->data).smpl.samplerSpecificDataSizeInBytes =
                   (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
            }
            else {
              local_30 = (ma_uint8 *)
                         ma_dr_wav__read_bext_to_metadata_obj
                                   ((ma_dr_wav__metadata_parser *)buffer_1._112_8_,
                                    (ma_dr_wav_metadata *)buffer_1._104_8_,buffer_1._96_8_);
              if (local_30 == *(ma_uint8 **)(local_18 + 0x10)) {
                *(long *)((long)&local_10->data + 0x38) =
                     *(long *)((long)&local_10->data + 0x38) + 1;
              }
            }
          }
        }
        else if (3 < *(ulong *)(local_18 + 0x10)) {
          if ((local_10->data).smpl.midiPitchFraction == 0) {
            (local_10->data).smpl.samplerSpecificDataSizeInBytes =
                 (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
            ma_dr_wav__metadata_request_extra_memory_for_stage_2
                      ((ma_dr_wav__metadata_parser *)local_10,
                       ((*(long *)(local_18 + 0x10) - 4U) / 0x18) * 0x18,8);
          }
          else {
            local_30 = (ma_uint8 *)
                       ma_dr_wav__read_cue_to_metadata_obj
                                 (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                  in_stack_fffffffffffffe68);
            if (local_30 == *(ma_uint8 **)(local_18 + 0x10)) {
              *(long *)((long)&local_10->data + 0x38) = *(long *)((long)&local_10->data + 0x38) + 1;
            }
          }
        }
      }
      else if (*(long *)(local_18 + 0x10) == 0x18) {
        if ((local_10->data).smpl.midiPitchFraction == 0) {
          (local_10->data).smpl.samplerSpecificDataSizeInBytes =
               (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
        }
        else {
          local_30 = (ma_uint8 *)
                     ma_dr_wav__read_acid_to_metadata_obj
                               (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          if (local_30 == *(ma_uint8 **)(local_18 + 0x10)) {
            *(long *)((long)&local_10->data + 0x38) = *(long *)((long)&local_10->data + 0x38) + 1;
          }
        }
      }
    }
    else if (*(long *)(local_18 + 0x10) == 7) {
      if ((local_10->data).smpl.midiPitchFraction == 0) {
        (local_10->data).smpl.samplerSpecificDataSizeInBytes =
             (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
      }
      else {
        local_30 = (ma_uint8 *)
                   ma_dr_wav__read_inst_to_metadata_obj
                             (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        if (local_30 == *(ma_uint8 **)(local_18 + 0x10)) {
          *(long *)((long)&local_10->data + 0x38) = *(long *)((long)&local_10->data + 0x38) + 1;
        }
      }
    }
  }
  else if (0x23 < *(ulong *)(local_18 + 0x10)) {
    if ((local_10->data).smpl.midiPitchFraction == 0) {
      iVar2 = (**(code **)&local_10->data)((local_10->data).cue.pCuePoints,0x1c,1);
      if (iVar2 == 0) {
        return (ma_uint64)local_30;
      }
      local_30 = local_30 + 0x1c;
      sVar5 = ma_dr_wav__metadata_parser_read
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x215f7c);
      if (((sVar5 == 4) &&
          (mVar3 = ma_dr_wav_bytes_to_u32(local_34),
          (*(long *)(local_18 + 0x10) - 0x24U) / 0x18 == (ulong)mVar3)) &&
         (sVar5 = ma_dr_wav__metadata_parser_read
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             (size_t)in_stack_fffffffffffffe28,(ma_uint64 *)0x216003), sVar5 == 4))
      {
        mVar4 = ma_dr_wav_bytes_to_u32(local_34);
        (local_10->data).smpl.samplerSpecificDataSizeInBytes =
             (local_10->data).smpl.samplerSpecificDataSizeInBytes + 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2
                  ((ma_dr_wav__metadata_parser *)local_10,(ulong)mVar3 * 0x18,8);
        ma_dr_wav__metadata_request_extra_memory_for_stage_2
                  ((ma_dr_wav__metadata_parser *)local_10,(ulong)mVar4,1);
      }
    }
    else {
      local_30 = (ma_uint8 *)
                 ma_dr_wav__read_smpl_to_metadata_obj
                           (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                            in_stack_fffffffffffffe88);
      if (local_30 == *(ma_uint8 **)(local_18 + 0x10)) {
        *(long *)((long)&local_10->data + 0x38) = *(long *)((long)&local_10->data + 0x38) + 1;
      }
    }
  }
  return (ma_uint64)local_30;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_chunk(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata_type allowedMetadataTypes)
{
    const ma_uint8 *pChunkID = pChunkHeader->id.fourcc;
    ma_uint64 bytesRead = 0;
    if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_smpl, "smpl")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_SMPL_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                ma_uint8 buffer[4];
                size_t bytesJustRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, 28, ma_dr_wav_seek_origin_current)) {
                    return bytesRead;
                }
                bytesRead += 28;
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                if (bytesJustRead == sizeof(buffer)) {
                    ma_uint32 loopCount = ma_dr_wav_bytes_to_u32(buffer);
                    ma_uint64 calculatedLoopCount;
                    calculatedLoopCount = (pChunkHeader->sizeInBytes - MA_DR_WAV_SMPL_BYTES) / MA_DR_WAV_SMPL_LOOP_BYTES;
                    if (calculatedLoopCount == loopCount) {
                        bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                        if (bytesJustRead == sizeof(buffer)) {
                            ma_uint32 samplerSpecificDataSizeInBytes = ma_dr_wav_bytes_to_u32(buffer);
                            pParser->metadataCount += 1;
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_smpl_loop) * loopCount, MA_DR_WAV_METADATA_ALIGNMENT);
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, samplerSpecificDataSizeInBytes, 1);
                        }
                    } else {
                    }
                }
            } else {
                bytesRead = ma_dr_wav__read_smpl_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_inst, "inst")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_INST_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_inst_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_acid, "acid")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_ACID_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_acid_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_cue, "cue ")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_CUE_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                size_t cueCount;
                pParser->metadataCount += 1;
                cueCount = (size_t)(pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_cue_point) * cueCount, MA_DR_WAV_METADATA_ALIGNMENT);
            } else {
                bytesRead = ma_dr_wav__read_cue_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_bext, "bext")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_BEXT_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                char buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES + 1];
                size_t allocSizeNeeded = MA_DR_WAV_BEXT_UMID_BYTES;
                size_t bytesJustRead;
                buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_DESCRIPTION_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_DESCRIPTION_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                allocSizeNeeded += (size_t)pChunkHeader->sizeInBytes - MA_DR_WAV_BEXT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, allocSizeNeeded, 1);
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_bext_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], pChunkHeader->sizeInBytes);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav_fourcc_equal(pChunkID, "LIST") || ma_dr_wav_fourcc_equal(pChunkID, "list")) {
        ma_dr_wav_metadata_location listType = ma_dr_wav_metadata_location_invalid;
        while (bytesRead < pChunkHeader->sizeInBytes) {
            ma_uint8 subchunkId[4];
            ma_uint8 subchunkSizeBuffer[4];
            ma_uint64 subchunkDataSize;
            ma_uint64 subchunkBytesRead = 0;
            ma_uint64 bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkId, sizeof(subchunkId), &bytesRead);
            if (bytesJustRead != sizeof(subchunkId)) {
                break;
            }
            if (ma_dr_wav_fourcc_equal(subchunkId, "adtl")) {
                listType = ma_dr_wav_metadata_location_inside_adtl_list;
                continue;
            } else if (ma_dr_wav_fourcc_equal(subchunkId, "INFO")) {
                listType = ma_dr_wav_metadata_location_inside_info_list;
                continue;
            }
            bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkSizeBuffer, sizeof(subchunkSizeBuffer), &bytesRead);
            if (bytesJustRead != sizeof(subchunkSizeBuffer)) {
                break;
            }
            subchunkDataSize = ma_dr_wav_bytes_to_u32(subchunkSizeBuffer);
            if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_label, "labl") || ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_note, "note")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES) {
                    ma_uint64 stringSizeWithNullTerm = subchunkDataSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerm, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_label_or_note_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize, ma_dr_wav_fourcc_equal(subchunkId, "labl") ? ma_dr_wav_metadata_type_list_label : ma_dr_wav_metadata_type_list_note);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_labelled_cue_region, "ltxt")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABELLED_TEXT_BYTES) {
                    ma_uint64 stringSizeWithNullTerminator = subchunkDataSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerminator, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_software, "ISFT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_software);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_copyright, "ICOP")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_copyright);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_title, "INAM")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_title);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_artist, "IART")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_artist);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_comment, "ICMT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_comment);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_date, "ICRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_date);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_genre, "IGNR")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_genre);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_album, "IPRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_album);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_tracknumber, "ITRK")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_tracknumber);
            } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
                subchunkBytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, subchunkId, subchunkDataSize, listType);
            }
            bytesRead += subchunkBytesRead;
            MA_DR_WAV_ASSERT(subchunkBytesRead <= subchunkDataSize);
            if (subchunkBytesRead < subchunkDataSize) {
                ma_uint64 bytesToSeek = subchunkDataSize - subchunkBytesRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += bytesToSeek;
            }
            if ((subchunkDataSize % 2) == 1) {
                if (!pParser->onSeek(pParser->pReadSeekUserData, 1, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += 1;
            }
        }
    } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
        bytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, pChunkID, pChunkHeader->sizeInBytes, ma_dr_wav_metadata_location_top_level);
    }
    return bytesRead;
}